

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_packing_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::StructPackingPass::StructPackingPass
          (StructPackingPass *this,char *structToPack,PackingRules rules)

{
  char *local_38;
  allocator<char> local_1d;
  PackingRules local_1c;
  char *pcStack_18;
  PackingRules rules_local;
  char *structToPack_local;
  StructPackingPass *this_local;
  
  local_1c = rules;
  pcStack_18 = structToPack;
  structToPack_local = (char *)this;
  Pass::Pass(&this->super_Pass);
  (this->super_Pass)._vptr_Pass = (_func_int **)&PTR__StructPackingPass_013b6a18;
  if (pcStack_18 == (char *)0x0) {
    local_38 = "";
  }
  else {
    local_38 = pcStack_18;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->structToPack_,local_38,&local_1d);
  std::allocator<char>::~allocator(&local_1d);
  this->packingRules_ = local_1c;
  std::
  unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  ::unordered_map(&this->constantsMap_);
  return;
}

Assistant:

StructPackingPass::StructPackingPass(const char* structToPack,
                                     PackingRules rules)
    : structToPack_{structToPack != nullptr ? structToPack : ""},
      packingRules_{rules} {}